

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_unit.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_75e5::ShadowedART::assertLowerBoundValid(ShadowedART *this,Key key)

{
  art_iterator_t art_it;
  iterator shadow_it;
  map<(anonymous_namespace)::Key,_unsigned_long,_std::less<(anonymous_namespace)::Key>,_std::allocator<std::pair<const_(anonymous_namespace)::Key,_unsigned_long>_>_>
  *in_stack_ffffffffffffff48;
  art_key_chunk_t *in_stack_ffffffffffffff58;
  art_t *in_stack_ffffffffffffff60;
  
  std::
  map<(anonymous_namespace)::Key,_unsigned_long,_std::less<(anonymous_namespace)::Key>,_std::allocator<std::pair<const_(anonymous_namespace)::Key,_unsigned_long>_>_>
  ::lower_bound(in_stack_ffffffffffffff48,(key_type *)0x1076b1);
  Key::data((Key *)0x1076d6);
  art_lower_bound(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  assertIteratorValid((ShadowedART *)art_it.frames[2].ref,(iterator *)art_it.frames[1]._8_8_,
                      (art_iterator_t *)art_it.frames[1].ref);
  return;
}

Assistant:

void assertLowerBoundValid(Key key) {
        auto shadow_it = shadow_.lower_bound(key);
        auto art_it = art_lower_bound(&art_, key.data());
        assertIteratorValid(shadow_it, &art_it);
    }